

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<spirv_cross::Meta::Decoration,_0UL>::resize
          (SmallVector<spirv_cross::Meta::Decoration,_0UL> *this,size_t new_size)

{
  undefined8 *puVar1;
  ulong uVar2;
  Decoration *pDVar3;
  undefined8 *puVar4;
  char *pcVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  
  uVar2 = (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size;
  if (new_size < uVar2) {
    lVar6 = new_size * 0x188;
    sVar7 = new_size;
    do {
      pDVar3 = (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr;
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)((long)(pDVar3->extended).values + lVar6 + -0x38));
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)((long)&(pDVar3->decoration_flags).higher._M_h._M_buckets + lVar6));
      pcVar5 = *(char **)((long)&(pDVar3->user_type)._M_dataplus._M_p + lVar6);
      if ((pDVar3->user_type).field_2._M_local_buf + lVar6 != pcVar5) {
        operator_delete(pcVar5);
      }
      pcVar5 = *(char **)((long)&(pDVar3->hlsl_semantic)._M_dataplus._M_p + lVar6);
      if ((pDVar3->hlsl_semantic).field_2._M_local_buf + lVar6 != pcVar5) {
        operator_delete(pcVar5);
      }
      pcVar5 = *(char **)((long)&(pDVar3->qualified_alias)._M_dataplus._M_p + lVar6);
      if ((pDVar3->qualified_alias).field_2._M_local_buf + lVar6 != pcVar5) {
        operator_delete(pcVar5);
      }
      puVar1 = (undefined8 *)((long)&(pDVar3->alias)._M_dataplus._M_p + lVar6);
      puVar4 = (undefined8 *)*puVar1;
      if (puVar1 + 2 != puVar4) {
        operator_delete(puVar4);
      }
      sVar7 = sVar7 + 1;
      lVar6 = lVar6 + 0x188;
    } while (sVar7 < (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size);
  }
  else if (uVar2 < new_size) {
    reserve(this,new_size);
    uVar2 = (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size;
    lVar6 = new_size - uVar2;
    if (uVar2 <= new_size && lVar6 != 0) {
      lVar8 = uVar2 * 0x188;
      do {
        pDVar3 = (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr;
        puVar1 = (undefined8 *)((long)&(pDVar3->alias)._M_dataplus._M_p + lVar8);
        memset(puVar1 + 2,0,0x120);
        *puVar1 = puVar1 + 2;
        puVar1[1] = 0;
        pcVar5 = (pDVar3->qualified_alias).field_2._M_local_buf + lVar8;
        *(char **)((long)&(pDVar3->qualified_alias)._M_dataplus._M_p + lVar8) = pcVar5;
        *pcVar5 = '\0';
        pcVar5 = (pDVar3->hlsl_semantic).field_2._M_local_buf + lVar8;
        *(char **)(pcVar5 + -0x10) = pcVar5;
        *pcVar5 = '\0';
        pcVar5 = (pDVar3->user_type).field_2._M_local_buf + lVar8;
        *(char **)(pcVar5 + -0x10) = pcVar5;
        *pcVar5 = '\0';
        puVar1 = (undefined8 *)
                 ((long)&(pDVar3->decoration_flags).higher._M_h._M_single_bucket + lVar8);
        puVar1[-6] = puVar1;
        puVar1[-5] = 1;
        puVar1[-4] = 0;
        puVar1[-3] = 0;
        *(undefined4 *)(puVar1 + -2) = 0x3f800000;
        puVar1[-1] = 0;
        *puVar1 = 0;
        *(undefined4 *)(puVar1 + 1) = 0x7fffffff;
        *(undefined8 *)((long)puVar1 + 0xc) = 0;
        *(undefined8 *)((long)puVar1 + 0x14) = 0;
        *(undefined8 *)((long)puVar1 + 0x1c) = 0;
        *(undefined8 *)((long)puVar1 + 0x24) = 0;
        *(undefined8 *)((long)puVar1 + 0x2c) = 0;
        *(undefined8 *)((long)puVar1 + 0x34) = 0;
        *(undefined4 *)((long)puVar1 + 0x3c) = 0;
        *(undefined4 *)(puVar1 + 8) = 0x7fffffff;
        *(undefined1 *)((long)puVar1 + 0x45) = 0;
        puVar1 = (undefined8 *)((long)(pDVar3->extended).values + lVar8 + -8);
        puVar1[-6] = puVar1;
        puVar1[-5] = 1;
        puVar1[-4] = 0;
        puVar1[-3] = 0;
        *(undefined4 *)(puVar1 + -2) = 0x3f800000;
        puVar1[-1] = 0;
        *puVar1 = 0;
        puVar1[7] = 0;
        puVar1[8] = 0;
        puVar1[5] = 0;
        puVar1[6] = 0;
        puVar1[3] = 0;
        puVar1[4] = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[9] = 0;
        lVar8 = lVar8 + 0x188;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
  }
  (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size = new_size;
  return;
}

Assistant:

void resize(size_t new_size) SPIRV_CROSS_NOEXCEPT
	{
		if (new_size < this->buffer_size)
		{
			for (size_t i = new_size; i < this->buffer_size; i++)
				this->ptr[i].~T();
		}
		else if (new_size > this->buffer_size)
		{
			reserve(new_size);
			for (size_t i = this->buffer_size; i < new_size; i++)
				new (&this->ptr[i]) T();
		}

		this->buffer_size = new_size;
	}